

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aomstats.c
# Opt level: O0

void stats_close(stats_io_t *stats,int last_pass)

{
  int in_ESI;
  undefined8 *in_RDI;
  
  if (in_RDI[3] == 0) {
    if (*(int *)(in_RDI + 2) == in_ESI) {
      free((void *)*in_RDI);
    }
  }
  else {
    if (*(int *)(in_RDI + 2) == in_ESI) {
      free((void *)*in_RDI);
    }
    fclose((FILE *)in_RDI[3]);
    in_RDI[3] = 0;
  }
  return;
}

Assistant:

void stats_close(stats_io_t *stats, int last_pass) {
  if (stats->file) {
    if (stats->pass == last_pass) {
      free(stats->buf.buf);
    }

    fclose(stats->file);
    stats->file = NULL;
  } else {
    if (stats->pass == last_pass) free(stats->buf.buf);
  }
}